

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<16u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  Ch *pCVar2;
  bool bVar3;
  SizeType SVar4;
  Ch CVar5;
  bool bVar6;
  MemoryStream *pMVar7;
  ulong uVar8;
  char *pcVar9;
  Ch *decimals;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar10;
  int iVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte bVar14;
  uint16_t uVar15;
  byte *pbVar16;
  uint uVar17;
  int iVar18;
  ushort uVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
  s;
  Number local_78;
  
  s.stackStream.length_ = 0;
  pMVar7 = is->is_;
  pcVar1 = pMVar7->src_;
  pCVar2 = pMVar7->begin_;
  if ((pcVar1 == pMVar7->end_) || (*pcVar1 != '-')) {
    bVar6 = false;
    pcVar9 = pcVar1;
  }
  else {
    pMVar7->src_ = pcVar1 + 1;
    bVar6 = true;
    pcVar9 = pcVar1 + 1;
  }
  s.
  super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
  .is = is;
  s.stackStream.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  if (pcVar9 == pMVar7->end_) {
LAB_002b5828:
    if (*(int *)(this + 0x30) == 0) {
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pcVar9 - (long)pCVar2;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                  ,0x4b2,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (*pcVar9 == '0') {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
    ::TakePush(&s);
    pMVar7 = (s.
              super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
             .is)->is_;
    pbVar12 = (byte *)pMVar7->src_;
    local_78 = (Number)0x0;
    bVar24 = false;
    bVar22 = false;
    iVar18 = 0;
    uVar23 = 0;
    bVar3 = false;
    uVar17 = 0;
  }
  else {
    if (8 < (byte)(*pcVar9 - 0x31U)) goto LAB_002b5828;
    CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
            ::TakePush(&s);
    uVar17 = (int)CVar5 - 0x30;
    pMVar7 = (s.
              super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
             .is)->is_;
    pbVar12 = (byte *)pMVar7->src_;
    if (bVar6) {
      if (pbVar12 != (byte *)pMVar7->end_) {
        iVar18 = 0;
LAB_002b509a:
        if (9 < (byte)(*pbVar12 - 0x30)) goto LAB_002b51ff;
        if (uVar17 < 0xccccccc) {
LAB_002b50b1:
          CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                  ::TakePush(&s);
          uVar17 = (uVar17 * 10 + (int)CVar5) - 0x30;
          iVar18 = iVar18 + 1;
          pMVar7 = (s.
                    super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                   .is)->is_;
          pbVar12 = (byte *)pMVar7->src_;
          if (pbVar12 == (byte *)pMVar7->end_) goto LAB_002b51ff;
          goto LAB_002b509a;
        }
        if (uVar17 != 0xccccccc) goto LAB_002b5152;
        if (*pbVar12 != 0x39) goto LAB_002b50b1;
        uVar17 = 0xccccccc;
LAB_002b5152:
        uVar23 = (ulong)uVar17;
        if (bVar6) {
          if (pbVar12 != (byte *)pMVar7->end_) {
LAB_002b518d:
            if (9 < (byte)(*pbVar12 - 0x30)) goto LAB_002b5328;
            if (uVar23 < 0xccccccccccccccc) {
LAB_002b51a1:
              CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::
                      NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                      ::TakePush(&s);
              uVar23 = (ulong)((int)CVar5 - 0x30) + uVar23 * 10;
              iVar18 = iVar18 + 1;
              pMVar7 = (s.
                        super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                       .is)->is_;
              pbVar12 = (byte *)pMVar7->src_;
              if (pbVar12 == (byte *)pMVar7->end_) goto LAB_002b5328;
              goto LAB_002b518d;
            }
            if (uVar23 != 0xccccccccccccccc) goto LAB_002b5297;
            if (*pbVar12 != 0x39) goto LAB_002b51a1;
            uVar23 = 0xccccccccccccccc;
LAB_002b5297:
            auVar25._8_4_ = (int)(uVar23 >> 0x20);
            auVar25._0_8_ = uVar23;
            auVar25._12_4_ = 0x45300000;
            local_78.d = (auVar25._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
            if ((pbVar12 != (byte *)pMVar7->end_) && ((byte)(*pbVar12 - 0x30) < 10)) {
              do {
                if (1.7976931348623158e+307 <= local_78.d) {
                  if (*(int *)(this + 0x30) != 0) {
                    __assert_fail("!HasParseError()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                                  ,0x4d3,
                                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                                 );
                  }
                  goto LAB_002b5677;
                }
                CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                        ::
                        NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                        ::TakePush(&s);
                local_78.d = (double)(CVar5 + -0x30) + local_78.d * 10.0;
                pMVar7 = (s.
                          super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                         .is)->is_;
                pbVar12 = (byte *)pMVar7->src_;
              } while ((pbVar12 != (byte *)pMVar7->end_) && ((byte)(*pbVar12 - 0x30) < 10));
            }
            bVar24 = true;
            bVar22 = true;
LAB_002b532d:
            bVar3 = true;
            goto LAB_002b5330;
          }
        }
        else if (pbVar12 != (byte *)pMVar7->end_) {
          do {
            if (9 < (byte)(*pbVar12 - 0x30)) break;
            if (0x1999999999999998 < uVar23) {
              if (uVar23 != 0x1999999999999999) goto LAB_002b5297;
              if (0x35 < *pbVar12) {
                uVar23 = 0x1999999999999999;
                goto LAB_002b5297;
              }
            }
            CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::
                    NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                    ::TakePush(&s);
            uVar23 = (ulong)((int)CVar5 - 0x30) + uVar23 * 10;
            iVar18 = iVar18 + 1;
            pMVar7 = (s.
                      super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                     .is)->is_;
            pbVar12 = (byte *)pMVar7->src_;
          } while (pbVar12 != (byte *)pMVar7->end_);
LAB_002b5328:
          local_78 = (Number)0x0;
          bVar24 = false;
          bVar22 = false;
          goto LAB_002b532d;
        }
        local_78 = (Number)0x0;
        bVar3 = true;
        bVar24 = false;
        bVar22 = false;
        goto LAB_002b5330;
      }
LAB_002b5808:
      iVar18 = 0;
    }
    else {
      if (pbVar12 == (byte *)pMVar7->end_) goto LAB_002b5808;
      iVar18 = 0;
      do {
        if (9 < (byte)(*pbVar12 - 0x30)) break;
        if (0x19999998 < uVar17) {
          if (uVar17 != 0x19999999) goto LAB_002b5152;
          if (0x35 < *pbVar12) {
            uVar17 = 0x19999999;
            goto LAB_002b5152;
          }
        }
        CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                ::TakePush(&s);
        uVar17 = (uVar17 * 10 + (int)CVar5) - 0x30;
        iVar18 = iVar18 + 1;
        pMVar7 = (s.
                  super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                 .is)->is_;
        pbVar12 = (byte *)pMVar7->src_;
      } while (pbVar12 != (byte *)pMVar7->end_);
    }
LAB_002b51ff:
    bVar22 = false;
    bVar24 = false;
    local_78 = (Number)0x0;
    uVar23 = 0;
    bVar3 = false;
  }
LAB_002b5330:
  SVar4 = s.stackStream.length_;
  pbVar16 = (byte *)pMVar7->end_;
  uVar20 = (ulong)uVar17;
  if ((pbVar12 == pbVar16) || (*pbVar12 != 0x2e)) {
    iVar21 = 0;
  }
  else {
    pbVar12 = pbVar12 + 1;
    pMVar7->src_ = (Ch *)pbVar12;
    if ((pbVar12 == pbVar16) || ((byte)(*pbVar12 - 0x3a) < 0xf6)) {
      if (*(int *)(this + 0x30) == 0) {
        pCVar2 = pMVar7->begin_;
        *(undefined4 *)(this + 0x30) = 0xe;
        *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar2;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                    ,0x4df,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    iVar21 = 0;
    if (!bVar24) {
      if (!bVar3) {
        uVar23 = uVar20;
      }
      bVar14 = *pbVar12;
      if ((char)bVar14 < '0') {
        iVar21 = 0;
      }
      else {
        iVar11 = 0;
        do {
          iVar21 = iVar11;
          if ((0x39 < bVar14) || (uVar23 >> 0x35 != 0)) goto LAB_002b53f8;
          CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                  ::TakePush(&s);
          uVar23 = (ulong)((int)CVar5 - 0x30) + uVar23 * 10;
          iVar18 = iVar18 + (uint)(uVar23 != 0);
          pMVar7 = (s.
                    super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                   .is)->is_;
          pbVar12 = (byte *)pMVar7->src_;
          if (pbVar12 == (byte *)pMVar7->end_) break;
          bVar14 = *pbVar12;
          iVar11 = iVar21 + -1;
        } while ('/' < (char)bVar14);
        iVar21 = iVar21 + -1;
      }
LAB_002b53f8:
      pbVar16 = (byte *)pMVar7->end_;
      auVar26._8_4_ = (int)(uVar23 >> 0x20);
      auVar26._0_8_ = uVar23;
      auVar26._12_4_ = 0x45300000;
      local_78.d = (auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
      bVar22 = true;
    }
    if (pbVar12 != pbVar16) {
      if ((byte)(*pbVar12 - 0x30) < 10) {
        do {
          CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                  ::TakePush(&s);
          if (iVar18 < 0x11) {
            local_78.d = (double)(CVar5 + -0x30) + local_78.d * 10.0;
            iVar21 = iVar21 + -1;
            if (0.0 < local_78.d) {
              iVar18 = iVar18 + 1;
            }
          }
          pMVar7 = (s.
                    super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                   .is)->is_;
          pbVar12 = (byte *)pMVar7->src_;
        } while ((pbVar12 != (byte *)pMVar7->end_) && ((byte)(*pbVar12 - 0x30) < 10));
      }
      pbVar16 = (byte *)pMVar7->end_;
    }
  }
  iVar18 = 0;
  if ((pbVar12 != pbVar16) && ((*pbVar12 == 0x65 || (*pbVar12 == 0x45)))) {
    pbVar13 = pbVar12 + 1;
    pMVar7->src_ = (Ch *)pbVar13;
    uVar8 = uVar20;
    if (bVar3) {
      uVar8 = uVar23;
    }
    if (!bVar22) {
      auVar27._8_4_ = (int)(uVar8 >> 0x20);
      auVar27._0_8_ = uVar8;
      auVar27._12_4_ = 0x45300000;
      local_78.d = (auVar27._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
      bVar22 = true;
    }
    if ((pbVar13 == pbVar16) || ((bVar24 = *pbVar13 != 0x2b, bVar24 && (*pbVar13 != 0x2d)))) {
      bVar24 = false;
    }
    else {
      pbVar13 = pbVar12 + 2;
      pMVar7->src_ = (Ch *)pbVar13;
    }
    if ((pbVar13 == pbVar16) || (9 < (byte)(*pbVar13 - 0x30))) {
      if (*(int *)(this + 0x30) == 0) {
        pCVar2 = pMVar7->begin_;
        *(undefined4 *)(this + 0x30) = 0xf;
        *(long *)(this + 0x38) = (long)pbVar13 - (long)pCVar2;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                    ,0x52b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pbVar12 = pbVar13 + 1;
    pMVar7->src_ = (Ch *)pbVar12;
    iVar11 = (char)*pbVar13 + -0x30;
    if (!bVar24) {
      do {
        if ((pbVar12 == pbVar16) || (9 < (byte)(*pbVar12 - 0x30))) goto LAB_002b55ac;
        pMVar7->src_ = (Ch *)(pbVar12 + 1);
        iVar11 = iVar11 * 10 + (int)(char)*pbVar12 + -0x30;
        pbVar12 = pbVar12 + 1;
      } while (iVar11 <= 0x134 - iVar21);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                      ,0x526,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_002b5677:
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_002b567e;
    }
    while ((pbVar12 != pbVar16 && ((byte)(*pbVar12 - 0x30) < 10))) {
      pbVar13 = pbVar12 + 1;
      pMVar7->src_ = (Ch *)pbVar13;
      iVar11 = iVar11 * 10 + (int)(char)*pbVar12 + -0x30;
      pbVar12 = pbVar13;
      if (0xccccccb < iVar11) {
        while ((pbVar12 = pbVar13, pbVar13 != pbVar16 && ((byte)(*pbVar13 - 0x30) < 10))) {
          pbVar13 = pbVar13 + 1;
          pMVar7->src_ = (Ch *)pbVar13;
        }
      }
    }
LAB_002b55ac:
    iVar18 = -iVar11;
    if (!bVar24) {
      iVar18 = iVar11;
    }
  }
  uVar8 = (ulong)s.stackStream.length_;
  pcVar9 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(s.stackStream.stack_,1);
  *pcVar9 = '\0';
  s.stackStream.length_ = s.stackStream.length_ + 1;
  decimals = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             StackStream<char>::Pop(&s.stackStream);
  if (bVar22) {
    local_78.i = (I)internal::StrtodFullPrecision
                              (local_78.i,iVar21 + iVar18,decimals,uVar8,(ulong)SVar4,iVar18);
    if (bVar6) {
      local_78.u64 = local_78.u64 ^ 0x8000000000000000;
    }
    pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar10->data_).s.str = (Ch *)0x0;
    *(undefined8 *)((long)&pGVar10->data_ + 0x10) = 0;
    (pGVar10->data_).n = local_78;
    (pGVar10->data_).f.flags = 0x216;
    return;
  }
  if (!bVar3) {
    if (bVar6) {
      pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar10->data_).s.str = (Ch *)0x0;
      *(undefined8 *)((long)&pGVar10->data_ + 0x10) = 0;
      *(long *)&pGVar10->data_ = (long)(int)-uVar17;
      uVar15 = 0xb6;
      if ((int)uVar17 < 1) {
        uVar15 = 0x1f6;
      }
      (pGVar10->data_).f.flags = uVar15;
      return;
    }
    pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar10->data_).s.str = (Ch *)0x0;
    *(undefined8 *)((long)&pGVar10->data_ + 0x10) = 0;
    *(ulong *)&pGVar10->data_ = uVar20;
    (pGVar10->data_).f.flags = (ushort)(-1 < (int)uVar17) << 5 | 0x1d6;
    return;
  }
  if (!bVar6) {
    pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar10->data_).s.str = (Ch *)0x0;
    *(undefined8 *)((long)&pGVar10->data_ + 0x10) = 0;
    *(ulong *)&pGVar10->data_ = uVar23;
    uVar19 = (ushort)(uVar23 < 0x80000000) << 5 | 0x1d6;
    if (uVar23 >> 0x20 != 0) {
      uVar19 = (ushort)(-1 < (long)uVar23) << 7 | 0x116;
    }
    (pGVar10->data_).f.flags = uVar19;
    return;
  }
  bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::Int64(handler,-uVar23);
  if (bVar6) {
    return;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                  ,0x56b,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_002b567e:
  *(long *)(this + 0x38) = (long)pcVar1 - (long)pCVar2;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }